

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
bioparser::Parser<biosoup::Sequence>::Parser
          (Parser<biosoup::Sequence> *this,gzFile file,uint32_t storage_size)

{
  ulong in_RAX;
  undefined8 uStack_28;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_00158b08;
  (this->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
  super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
  super__Tuple_impl<1UL,_int_(*)(gzFile_s_*)>.super__Head_base<1UL,_int_(*)(gzFile_s_*),_false>.
  _M_head_impl = gzclose;
  (this->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
  super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.super__Head_base<0UL,_gzFile_s_*,_false>.
  _M_head_impl = file;
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::vector
            (&this->buffer_,0x10000,(value_type *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  this->buffer_ptr_ = 0;
  this->buffer_bytes_ = 0;
  uStack_28._0_6_ = (uint6)(uint5)uStack_28;
  std::vector<char,_std::allocator<char>_>::vector
            (&this->storage_,(ulong)storage_size,(value_type *)((long)&uStack_28 + 5),
             (allocator_type *)((long)&uStack_28 + 4));
  this->storage_ptr_ = 0;
  return;
}

Assistant:

Parser(gzFile file, std::uint32_t storage_size)
      : file_(file, gzclose),
        buffer_(65536, 0),  // 64 kB
        buffer_ptr_(0),
        buffer_bytes_(0),
        storage_(storage_size, 0),
        storage_ptr_(0) {}